

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetRootValueForTypeOf<true,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  PropertyId propertyId_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *requestContext;
  DebugContext *pDVar5;
  RecyclableObject *propertyObject;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup local_50;
  AutoCleanup autoCleanup;
  DynamicObject *local_38;
  Var value;
  
  autoCleanup.scriptContext._4_4_ = propertyId;
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1fbb,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) goto LAB_00ae430e;
    *puVar4 = 0;
  }
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_a8 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,inlineCache,inlineCacheIndex,false);
  local_38 = (DynamicObject *)0x0;
  if (info._8_8_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x21,
                                "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())",
                                "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()");
    if (!bVar2) goto LAB_00ae430e;
    *puVar4 = 0;
  }
  if (info.inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x22,
                                "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                ,
                                "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                               );
    if (!bVar2) {
LAB_00ae430e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  propertyId_00 = autoCleanup.scriptContext._4_4_;
  bVar2 = PolymorphicInlineCache::TryGetProperty<true,true,true,false,false,false,false>
                    ((PolymorphicInlineCache *)info.inlineCache,object,
                     &object->super_RecyclableObject,autoCleanup.scriptContext._4_4_,&local_38,
                     requestContext,(PropertyCacheOperationInfo *)0x0,(InlineCache *)0x0);
  if (!bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
    if ((bVar2) && (DAT_015d346a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValueForTypeOf",propertyId_00,requestContext,
                 &object->super_RecyclableObject);
    }
    local_38 = (DynamicObject *)0x0;
    JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex,requestContext,true);
    local_50.scriptContext = requestContext;
    bVar2 = ScriptContext::IsScriptContextInDebugMode(requestContext);
    if (bVar2) {
      pDVar5 = ScriptContext::GetDebugContext(requestContext);
      pDVar5->diagProbesContainer->isThrowInternal = true;
    }
    propertyObject = VarTo<Js::RecyclableObject>(object);
    BVar3 = GetProperty_Internal<false>
                      (object,propertyObject,true,propertyId_00,&local_38,requestContext,
                       (PropertyValueInfo *)local_a8);
    if ((BVar3 != 0) &&
       (object = local_38,
       (DynamicObject *)
       (((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
       == local_38)) {
      JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
    PatchGetRootValueForTypeOf<true,_Js::PolymorphicInlineCache>::AutoCleanup::~AutoCleanup
              (&local_50);
    JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex);
    bVar2 = false;
    if ((BVar3 == 0) &&
       (bVar2 = true,
       (DynamicObject *)
       (((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
       == local_38)) {
      JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
    local_38 = object;
    if (bVar2) {
      local_38 = (DynamicObject *)
                 (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
    }
  }
  return local_38;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValueForTypeOf);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value = nullptr;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        value = nullptr;
        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        AssertOrFailFast(VarIsCorrectType(static_cast<RecyclableObject*>(object)));
        if (JavascriptOperators::GetRootProperty(object, propertyId, &value, scriptContext, &info))
        {
            if (scriptContext->IsUndeclBlockVar(value))
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }
        END_TYPEOF_ERROR_HANDLER(scriptContext, value);

        value = scriptContext->GetLibrary()->GetUndefined();
        return value;
        JIT_HELPER_END(Op_PatchGetRootValueForTypeOf);
    }